

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  nk_rune nVar1;
  nk_rune nVar2;
  int iVar3;
  ulong in_RAX;
  int iVar4;
  long lVar5;
  int type;
  int len;
  
  _type = in_RAX & 0xffffffff00000000;
  if (c == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x18f7,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (u != (nk_rune *)0x0) {
    iVar3 = 0;
    if (clen != 0) {
      *u = 0xfffd;
      nVar1 = nk_utf_decode_byte(*c,&len);
      if (len - 1U < 3) {
        for (lVar5 = 1; (iVar4 = (int)lVar5, lVar5 < clen && (iVar4 < len)); lVar5 = lVar5 + 1) {
          nVar2 = nk_utf_decode_byte(c[lVar5],&type);
          if (type != 0) {
            return iVar4;
          }
          nVar1 = nVar1 << 6 | nVar2;
        }
        iVar3 = 0;
        if (len <= iVar4) {
          *u = nVar1;
          nk_utf_validate(u,len);
          iVar3 = len;
        }
      }
      else {
        iVar3 = 1;
      }
    }
    return iVar3;
  }
  __assert_fail("u",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x18f8,"int nk_utf_decode(const char *, nk_rune *, int)");
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
    int i, j, len, type=0;
    nk_rune udecoded;

    NK_ASSERT(c);
    NK_ASSERT(u);

    if (!c || !u) return 0;
    if (!clen) return 0;
    *u = NK_UTF_INVALID;

    udecoded = nk_utf_decode_byte(c[0], &len);
    if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
        return 1;

    for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
        udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
        if (type != 0)
            return j;
    }
    if (j < len)
        return 0;
    *u = udecoded;
    nk_utf_validate(u, len);
    return len;
}